

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadImageLibrary(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  string id;
  Image local_a8;
  key_type local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"image");
        if (bVar1) {
          uVar3 = GetAttribute(this,"id");
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar2),
                     (allocator<char> *)&local_a8);
          local_a8.mEmbeddedFormat._M_string_length = 0;
          local_a8.mFileName.field_2._M_allocated_capacity = 0;
          local_a8.mFileName.field_2._8_8_ = 0;
          local_a8.mEmbeddedFormat.field_2._8_8_ = 0;
          local_a8.mFileName._M_string_length = 0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.mImageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.mEmbeddedFormat._M_dataplus._M_p = (pointer)&local_a8.mEmbeddedFormat.field_2;
          local_a8.mEmbeddedFormat.field_2._M_allocated_capacity = 0;
          local_a8.mFileName._M_dataplus._M_p = (pointer)&local_a8.mFileName.field_2;
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          Collada::Image::operator=(pmVar4,&local_a8);
          Collada::Image::~Image(&local_a8);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Image>_>_>
                   ::operator[](&this->mImageLibrary,&local_50);
          ReadImage(this,pmVar4);
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"library_images");
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Expected end of <library_images> element.",
                 (allocator<char> *)&local_50);
      ThrowException(this,&local_a8.mFileName);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadImageLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("image"))
            {
                // read ID. Another entry which is "optional" by design but obligatory in reality
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mImageLibrary[id] = Image();

                // read on from there
                ReadImage(mImageLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_images") != 0)
                ThrowException("Expected end of <library_images> element.");

            break;
        }
    }
}